

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.cc
# Opt level: O0

BIO * BIO_new(BIO_METHOD *type)

{
  int iVar1;
  CRYPTO_EX_DATA *ad;
  void *in_RSI;
  BIO *ret;
  BIO_METHOD *method_local;
  
  method_local = (BIO_METHOD *)OPENSSL_zalloc(0x48);
  if ((BIO *)method_local == (BIO *)0x0) {
    method_local = (BIO_METHOD *)0x0;
  }
  else {
    ((BIO *)method_local)->method = type;
    *(undefined4 *)((long)&((BIO *)method_local)->cb_arg + 4) = 1;
    ((BIO *)method_local)->retry_reason = 1;
    CRYPTO_new_ex_data((int)method_local + 8,in_RSI,ad);
    if ((type->create != (_func_600 *)0x0) &&
       (iVar1 = (*type->create)((BIO *)method_local), iVar1 == 0)) {
      OPENSSL_free(method_local);
      method_local = (BIO_METHOD *)0x0;
    }
  }
  return (BIO *)method_local;
}

Assistant:

BIO *BIO_new(const BIO_METHOD *method) {
  BIO *ret = reinterpret_cast<BIO *>(OPENSSL_zalloc(sizeof(BIO)));
  if (ret == NULL) {
    return NULL;
  }

  ret->method = method;
  ret->shutdown = 1;
  ret->references = 1;
  CRYPTO_new_ex_data(&ret->ex_data);

  if (method->create != NULL && !method->create(ret)) {
    OPENSSL_free(ret);
    return NULL;
  }

  return ret;
}